

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.c
# Opt level: O3

int getargs(HSQUIRRELVM v,int argc,char **argv,SQInteger *retval)

{
  byte bVar1;
  SQChar *filename;
  bool bVar2;
  SQObjectType SVar3;
  SQRESULT SVar4;
  char *pcVar5;
  long lVar6;
  char *filename_00;
  ulong params;
  uint uVar7;
  uint uVar8;
  SQChar *err;
  SQChar *local_38;
  
  *retval = 0;
  if (1 < argc) {
    uVar8 = 1;
    bVar2 = false;
    pcVar5 = (char *)0x0;
    do {
      filename = argv[(int)uVar8];
      if (*filename != '-') {
        SVar4 = sqstd_loadfile(v,filename,1);
        if (bVar2) {
          if (-1 < SVar4) {
            filename_00 = "out.cnut";
            if (pcVar5 != (char *)0x0) {
              filename_00 = pcVar5;
            }
            SVar4 = sqstd_writeclosuretofile(v,filename_00);
            if (-1 < SVar4) {
              return 2;
            }
          }
        }
        else if (-1 < SVar4) {
          sq_pushroottable(v);
          params = 1;
          if ((int)(uVar8 + 1) < argc) {
            lVar6 = 0;
            do {
              sq_pushstring(v,argv[(int)(uVar8 + 1) + lVar6],-1);
              lVar6 = lVar6 + 1;
            } while (~uVar8 + argc != (int)lVar6);
            params = (ulong)(argc - uVar8);
          }
          SVar4 = sq_call(v,params,1,1);
          if (SVar4 < 0) {
            return 3;
          }
          SVar3 = sq_gettype(v,-1);
          if (SVar3 == OT_INTEGER) {
            *retval = 0x5000002;
            sq_getinteger(v,-1,retval);
            return 2;
          }
          return 2;
        }
        sq_getlasterror(v);
        SVar4 = sq_getstring(v,-1,&local_38);
        if (SVar4 < 0) {
          return 0;
        }
        printf("Error [%s]\n",local_38);
        *retval = -2;
        return 3;
      }
      bVar1 = filename[1];
      if (bVar1 < 0x68) {
        uVar7 = uVar8;
        if (bVar1 == 99) {
          bVar2 = true;
        }
        else {
          if (bVar1 != 100) goto LAB_00110a19;
          sq_enabledebuginfo(v,1);
        }
      }
      else {
        if (bVar1 != 0x6f) {
          if (bVar1 == 0x76) {
            fprintf(_stdout,"%s %s (%d bits)\n","Squirrel 3.1 stable",
                    "Copyright (C) 2003-2017 Alberto Demichelis",0x40);
            return 2;
          }
          if (bVar1 == 0x68) {
            getargs_cold_1();
            return 2;
          }
LAB_00110a19:
          getargs_cold_2();
          return 3;
        }
        uVar7 = uVar8 + 1;
        pcVar5 = argv[(long)(int)uVar8 + 1];
      }
      uVar8 = uVar7 + 1;
    } while ((int)uVar8 < argc);
  }
  return 0;
}

Assistant:

int getargs(HSQUIRRELVM v,int argc, char* argv[],SQInteger *retval)
{
    int i;
    int compiles_only = 0;
#ifdef SQUNICODE
    static SQChar temp[500];
#endif
    char * output = NULL;
    *retval = 0;
    if(argc>1)
    {
        int arg=1,exitloop=0;

        while(arg < argc && !exitloop)
        {

            if(argv[arg][0]=='-')
            {
                switch(argv[arg][1])
                {
                case 'd': //DEBUG(debug infos)
                    sq_enabledebuginfo(v,1);
                    break;
                case 'c':
                    compiles_only = 1;
                    break;
                case 'o':
                    if(arg < argc) {
                        arg++;
                        output = argv[arg];
                    }
                    break;
                case 'v':
                    PrintVersionInfos();
                    return _DONE;

                case 'h':
                    PrintVersionInfos();
                    PrintUsage();
                    return _DONE;
                default:
                    PrintVersionInfos();
                    scprintf(_SC("unknown prameter '-%c'\n"),argv[arg][1]);
                    PrintUsage();
                    *retval = -1;
                    return _ERROR;
                }
            }else break;
            arg++;
        }

        // src file

        if(arg<argc) {
            const SQChar *filename=NULL;
#ifdef SQUNICODE
            mbstowcs(temp,argv[arg],strlen(argv[arg]));
            filename=temp;
#else
            filename=argv[arg];
#endif

            arg++;

            //sq_pushstring(v,_SC("ARGS"),-1);
            //sq_newarray(v,0);

            //sq_createslot(v,-3);
            //sq_pop(v,1);
            if(compiles_only) {
                if(SQ_SUCCEEDED(sqstd_loadfile(v,filename,SQTrue))){
                    const SQChar *outfile = _SC("out.cnut");
                    if(output) {
#ifdef SQUNICODE
                        int len = (int)(strlen(output)+1);
                        mbstowcs(sq_getscratchpad(v,len*sizeof(SQChar)),output,len);
                        outfile = sq_getscratchpad(v,-1);
#else
                        outfile = output;
#endif
                    }
                    if(SQ_SUCCEEDED(sqstd_writeclosuretofile(v,outfile)))
                        return _DONE;
                }
            }
            else {
                //if(SQ_SUCCEEDED(sqstd_dofile(v,filename,SQFalse,SQTrue))) {
                    //return _DONE;
                //}
                if(SQ_SUCCEEDED(sqstd_loadfile(v,filename,SQTrue))) {
                    int callargs = 1;
                    sq_pushroottable(v);
                    for(i=arg;i<argc;i++)
                    {
                        const SQChar *a;
#ifdef SQUNICODE
                        int alen=(int)strlen(argv[i]);
                        a=sq_getscratchpad(v,(int)(alen*sizeof(SQChar)));
                        mbstowcs(sq_getscratchpad(v,-1),argv[i],alen);
                        sq_getscratchpad(v,-1)[alen] = _SC('\0');
#else
                        a=argv[i];
#endif
                        sq_pushstring(v,a,-1);
                        callargs++;
                        //sq_arrayappend(v,-2);
                    }
                    if(SQ_SUCCEEDED(sq_call(v,callargs,SQTrue,SQTrue))) {
                        SQObjectType type = sq_gettype(v,-1);
                        if(type == OT_INTEGER) {
                            *retval = type;
                            sq_getinteger(v,-1,retval);
                        }
                        return _DONE;
                    }
                    else{
                        return _ERROR;
                    }

                }
            }
            //if this point is reached an error occurred
            {
                const SQChar *err;
                sq_getlasterror(v);
                if(SQ_SUCCEEDED(sq_getstring(v,-1,&err))) {
                    scprintf(_SC("Error [%s]\n"),err);
                    *retval = -2;
                    return _ERROR;
                }
            }

        }
    }

    return _INTERACTIVE;
}